

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiStreamParser.cpp
# Opt level: O2

Bit32u __thiscall
MT32Emu::MidiStreamParserImpl::parseSysex(MidiStreamParserImpl *this,Bit8u *stream,Bit32u length)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  do {
    uVar4 = uVar3 + 1;
    if (length <= uVar4) {
      uVar4 = (ulong)((int)uVar3 + 1);
      goto LAB_0015b59e;
    }
    bVar1 = stream[uVar3 + 1];
    uVar3 = uVar4;
  } while (-1 < (char)bVar1);
  if (bVar1 == 0xf7) {
    uVar4 = (ulong)((int)uVar4 + 1);
    (*this->midiReceiver->_vptr_MidiReceiver[1])(this->midiReceiver,stream,uVar4);
  }
  else if (bVar1 < 0xf8) {
    (**this->midiReporter->_vptr_MidiReporter)
              (this->midiReporter,"parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
  }
  else {
LAB_0015b59e:
    this->streamBufferSize = (Bit32u)uVar4;
    bVar2 = checkStreamBufferCapacity(this,false);
    if (bVar2) {
      memcpy(this->streamBuffer,stream,uVar4 & 0xffffffff);
    }
    else {
      *this->streamBuffer = *stream;
      this->streamBufferSize = this->streamBufferCapacity;
    }
  }
  return (Bit32u)uVar4;
}

Assistant:

Bit32u MidiStreamParserImpl::parseSysex(const Bit8u stream[], const Bit32u length) {
	// Find SysEx length
	Bit32u sysexLength = 1;
	while (sysexLength < length) {
		Bit8u nextByte = stream[sysexLength++];
		if (0x80 <= nextByte) {
			if (nextByte == 0xF7) {
				// End of SysEx
				midiReceiver.handleSysex(stream, sysexLength);
				return sysexLength;
			}
			if (0xF8 <= nextByte) {
				// The System Realtime message must be processed right after return
				// but the SysEx is actually fragmented and to be reconstructed in streamBuffer
				--sysexLength;
				break;
			}
			// Illegal status byte in SysEx message, aborting
			midiReporter.printDebug("parseSysex: SysEx message lacks end-of-sysex (0xf7), ignored");
			// Continue parsing from that point
			return sysexLength - 1;
		}
	}

	// Store incomplete SysEx message for further processing
	streamBufferSize = sysexLength;
	if (checkStreamBufferCapacity(false)) {
		memcpy(streamBuffer, stream, sysexLength);
	} else {
		// Not enough buffer capacity, don't care about the real buffer content, just mark the first byte
		*streamBuffer = *stream;
		streamBufferSize = streamBufferCapacity;
	}
	return sysexLength;
}